

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_data_pipelines.cpp
# Opt level: O0

void data_pipeline_2P_SP(size_t L,uint w)

{
  char *__s;
  uint in_ESI;
  Taskflow *in_RDI;
  Task test;
  Task datapipeline;
  DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
  pl;
  size_t cnt;
  vector<int,_std::allocator<int>_> collection;
  mutex mutex;
  atomic<unsigned_long> j2;
  size_t j1;
  Taskflow taskflow;
  size_t N;
  vector<int,_std::allocator<int>_> source;
  size_t maxN;
  Executor executor;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffa88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffa90;
  allocator<char> *repeat;
  Taskflow *in_stack_fffffffffffffaa0;
  size_type in_stack_fffffffffffffaa8;
  Executor *this;
  Taskflow *in_stack_fffffffffffffab0;
  Executor *this_00;
  DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
  *object;
  FlowBuilder *in_stack_fffffffffffffad8;
  allocator<char> local_4e1;
  string local_4e0 [24];
  DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>
  *in_stack_fffffffffffffb38;
  DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>
  *in_stack_fffffffffffffb40;
  pointer *in_stack_fffffffffffffb48;
  DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
  *in_stack_fffffffffffffb50;
  Task in_stack_fffffffffffffb78;
  size_t in_stack_fffffffffffffb80;
  undefined8 in_stack_fffffffffffffb88;
  Task local_450;
  pointer local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  Taskflow *local_428;
  pointer local_3f0;
  undefined8 local_3e8;
  undefined8 local_3e0;
  undefined8 local_3d8;
  undefined8 local_2c8;
  undefined1 local_2c0 [24];
  undefined1 local_2a8 [40];
  undefined1 local_280 [216];
  pointer local_1a8;
  int *local_1a0;
  int *local_198;
  undefined1 local_189 [385];
  Taskflow *local_8;
  
  __s = (char *)(ulong)in_ESI;
  object = (DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
            *)(local_189 + 0x31);
  local_8 = in_RDI;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffa90._M_current,
             in_stack_fffffffffffffa88._M_current);
  tf::Executor::Executor
            ((Executor *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
             (shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffb78._node);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x127bde);
  local_189._25_8_ = 100;
  this_00 = (Executor *)local_189;
  std::allocator<int>::allocator((allocator<int> *)0x127bfc);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0,
             in_stack_fffffffffffffaa8,(allocator_type *)in_stack_fffffffffffffaa0);
  std::allocator<int>::~allocator((allocator<int> *)0x127c22);
  local_198 = (int *)std::vector<int,_std::allocator<int>_>::begin
                               (in_stack_fffffffffffffa88._M_current);
  local_1a0 = (int *)std::vector<int,_std::allocator<int>_>::end
                               (in_stack_fffffffffffffa88._M_current);
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,0);
  for (local_1a8 = (pointer)0x0; local_1a8 < (pointer)0x65;
      local_1a8 = (pointer)((long)&(local_1a8->data).super__Variant_base<int,_std::monostate>.
                                   super__Move_assign_alias<int,_std::monostate>.
                                   super__Copy_assign_alias<int,_std::monostate>.
                                   super__Move_ctor_alias<int,_std::monostate>.
                                   super__Copy_ctor_alias<int,_std::monostate>.
                                   super__Variant_storage_alias<int,_std::monostate> + 1)) {
    tf::Taskflow::Taskflow(in_stack_fffffffffffffab0);
    local_280._8_8_ = (pointer)0x0;
    local_280._0_8_ = (pointer)0x0;
    std::mutex::mutex((mutex *)0x127cb6);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x127cc3);
    local_2c8 = 1;
    local_3f0 = local_1a8;
    local_3e8 = local_189 + 1;
    local_3e0 = local_280 + 8;
    local_3d8 = local_8;
    in_stack_fffffffffffffab0 = local_8;
    tf::make_data_pipe<tf::Pipeflow&,int,data_pipeline_2P_SP(unsigned_long,unsigned_int)::__0>
              ((PipeType)((ulong)in_stack_fffffffffffffa90._M_current >> 0x20),
               (callable_t *)in_stack_fffffffffffffa88._M_current);
    local_448 = local_1a8;
    local_440 = local_2c0;
    local_438 = local_2a8;
    local_430 = local_280;
    local_428 = local_8;
    tf::make_data_pipe<int,void,data_pipeline_2P_SP(unsigned_long,unsigned_int)::__1>
              ((PipeType)((ulong)in_stack_fffffffffffffa90._M_current >> 0x20),
               (callable_t *)in_stack_fffffffffffffa88._M_current);
    tf::
    DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:293:7)>_>
    ::DataPipeline(in_stack_fffffffffffffb50,(size_t)in_stack_fffffffffffffb48,
                   in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    tf::FlowBuilder::
    composed_of<tf::DataPipeline<tf::DataPipe<tf::Pipeflow&,int,data_pipeline_2P_SP(unsigned_long,unsigned_int)::__0>,tf::DataPipe<int,void,data_pipeline_2P_SP(unsigned_long,unsigned_int)::__1>>>
              (in_stack_fffffffffffffad8,object);
    this = (Executor *)&stack0xfffffffffffffb87;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)object,__s,
               (allocator<char> *)this_00);
    in_stack_fffffffffffffaa0 =
         (Taskflow *)
         tf::Task::name((Task *)in_stack_fffffffffffffa90._M_current,
                        (string *)in_stack_fffffffffffffa88._M_current);
    tf::Task::Task(&local_450,(Task *)in_stack_fffffffffffffaa0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffb88);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb87);
    in_stack_fffffffffffffb40 =
         (DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>
          *)(local_280 + 8);
    in_stack_fffffffffffffb48 = &local_1a8;
    in_stack_fffffffffffffb50 =
         (DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
          *)local_280;
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:305:34),_nullptr>
              (in_stack_fffffffffffffad8,(anon_class_48_6_b70a4db3 *)object);
    repeat = &local_4e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)object,__s,
               (allocator<char> *)this_00);
    in_stack_fffffffffffffa90._M_current =
         (int *)tf::Task::name(in_stack_fffffffffffffa90._M_current,
                               in_stack_fffffffffffffa88._M_current);
    tf::Task::Task((Task *)&stack0xfffffffffffffb78,(Task *)in_stack_fffffffffffffa90._M_current);
    std::__cxx11::string::~string(local_4e0);
    std::allocator<char>::~allocator(&local_4e1);
    tf::Task::precede<tf::Task&>
              ((Task *)in_stack_fffffffffffffa90._M_current,
               (Task *)in_stack_fffffffffffffa88._M_current);
    in_stack_fffffffffffffad8 = (FlowBuilder *)(local_280 + 8);
    tf::Executor::run_n<data_pipeline_2P_SP(unsigned_long,unsigned_int)::__3>
              (this,in_stack_fffffffffffffaa0,(size_t)repeat,
               (anon_class_32_4_5d790f4d *)in_stack_fffffffffffffa90._M_current);
    std::future<void>::get((future<void> *)in_stack_fffffffffffffaa0);
    tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffffa90._M_current);
    tf::
    DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:293:7)>_>
    ::~DataPipeline((DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
                     *)in_stack_fffffffffffffa90._M_current);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffaa0);
    tf::Taskflow::~Taskflow((Taskflow *)in_stack_fffffffffffffa90._M_current);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffaa0);
  tf::Executor::~Executor(this_00);
  return;
}

Assistant:

void data_pipeline_2P_SP(size_t L, unsigned w) {

  tf::Executor executor(w);

  const size_t maxN = 100;

  std::vector<int> source(maxN);
  std::iota(source.begin(), source.end(), 0);
  // std::vector<std::array<int, 2>> mybuffer(L);

  for(size_t N = 0; N <= maxN; N++) {

    tf::Taskflow taskflow;

    size_t j1 = 0;
    std::atomic<size_t> j2 = 0;
    std::mutex mutex;
    std::vector<int> collection;
    size_t cnt = 1;

    tf::DataPipeline pl(L,
      tf::make_data_pipe<tf::Pipeflow&, int>(tf::PipeType::SERIAL, [N, &source, &j1, L](auto& pf) mutable {
        if(j1 == N) {
          pf.stop();
          return 0;
        }
        REQUIRE(j1 == source[j1]);
        REQUIRE(pf.token() % L == pf.line());
        // mybuffer[pf.line()][pf.pipe()] = source[j1] + 1;
        // j1++;
        return source[j1++] + 1;
      }),

      tf::make_data_pipe<int, void>(tf::PipeType::PARALLEL,
      [N, &collection, &mutex, &j2, L](int& input, tf::Pipeflow& pf) mutable {
        REQUIRE(j2++ < N);
        {
          std::scoped_lock<std::mutex> lock(mutex);
          REQUIRE(pf.token() % L == pf.line());
          // collection.push_back(mybuffer[pf.line()][pf.pipe() - 1]);
          collection.push_back(input);
        }
      })
    );

    auto datapipeline = taskflow.composed_of(pl).name("module_of_datapipeline");
    auto test = taskflow.emplace([&](){
      REQUIRE(j1 == N);
      REQUIRE(j2 == N);

      std::sort(collection.begin(), collection.end());
      for(size_t i = 0; i < N; i++) {
        REQUIRE(collection[i] == i + 1);
      }
      REQUIRE(pl.num_tokens() == cnt * N);
    }).name("test");

    datapipeline.precede(test);

    executor.run_n(taskflow, 3, [&]() mutable {
      j1 = j2 = 0;
      collection.clear();
      // for(size_t i = 0; i < mybuffer.size(); ++i){
      //   for(size_t j = 0; j < mybuffer[0].size(); ++j){
      //     mybuffer[i][j] = 0;
      //   }
      // }
      cnt++;
    }).get();
  }
}